

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O1

int Abc_TtReadHex(word *pTruth,char *pString)

{
  byte bVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  word wVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  
  if (*pString == '0') {
    pString = pString + (ulong)(pString[1] == 'x') * 2;
  }
  if ((0xf5 < (byte)(*pString - 0x3aU)) || (uVar10 = 0, 0xf9 < (byte)((*pString & 0xdfU) + 0xb9))) {
    uVar10 = 0;
    do {
      do {
        lVar2 = uVar10 + 1;
        uVar10 = uVar10 + 1;
      } while (0xf5 < (byte)(((byte *)pString)[lVar2] - 0x3a));
    } while (0xf9 < (byte)((((byte *)pString)[lVar2] & 0xdf) + 0xb9));
  }
  uVar8 = (uint)uVar10;
  if (uVar8 == 1) {
    bVar1 = *pString;
    if (bVar1 < 0x41) {
      if (bVar1 != 0x30) {
        if (bVar1 == 0x35) goto LAB_0049f7f2;
        goto LAB_0049f7d4;
      }
    }
    else {
      if (bVar1 == 0x41) {
LAB_0049f7f2:
        wVar7 = 0xaaaaaaaaaaaaaaaa;
        if (bVar1 == 0x35) {
          wVar7 = 0x5555555555555555;
        }
        iVar5 = 1;
        goto LAB_0049f916;
      }
      if (bVar1 != 0x46) goto LAB_0049f7d4;
    }
    wVar7 = -(ulong)(bVar1 != 0x30);
    iVar5 = 0;
  }
  else {
LAB_0049f7d4:
    uVar3 = uVar8;
    if (1 < uVar8) {
      uVar3 = uVar8 - 1;
      if (uVar3 == 0) {
        uVar3 = 0;
      }
      else {
        uVar4 = 0x1f;
        if (uVar3 != 0) {
          for (; uVar3 >> uVar4 == 0; uVar4 = uVar4 - 1) {
          }
        }
        uVar3 = (uVar4 ^ 0xffffffe0) + 0x21;
      }
    }
    uVar4 = 1 << ((char)uVar3 - 4U & 0x1f);
    if (uVar3 < 5) {
      uVar4 = 1;
    }
    if (0 < (int)uVar4) {
      memset(pTruth,0,(ulong)uVar4 << 3);
    }
    if (uVar8 != 0) {
      uVar9 = 0;
      do {
        bVar1 = ((byte *)pString)[~uVar9 + (long)(int)uVar8];
        iVar5 = -0x30;
        if (((9 < (byte)(bVar1 - 0x30)) && (iVar5 = -0x37, 5 < (byte)(bVar1 + 0xbf))) &&
           (iVar5 = -0x57, 5 < (byte)(bVar1 + 0x9f))) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilTruth.h"
                        ,0x343,"int Abc_TtReadHexDigit(char)");
        }
        pTruth[uVar9 >> 4 & 0xfffffff] =
             pTruth[uVar9 >> 4 & 0xfffffff] |
             (ulong)(uint)(iVar5 + (char)bVar1) << ((char)uVar9 * '\x04' & 0x3fU);
        uVar9 = uVar9 + 1;
      } while (uVar9 != (uVar10 & 0xffffffff));
    }
    iVar5 = uVar3 + 2;
    if (3 < uVar3) {
      return iVar5;
    }
    uVar8 = (uint)*pTruth & 0xf;
    uVar10 = (ulong)(uVar8 << 4 | uVar8);
    if (uVar3 != 0) {
      uVar10 = *pTruth;
    }
    iVar6 = 3;
    if (uVar3 != 0) {
      iVar6 = iVar5;
    }
    uVar9 = (ulong)(uint)((int)(uVar10 & 0xff) << 8) | uVar10 & 0xff;
    if (iVar6 != 3) {
      uVar9 = uVar10;
    }
    uVar10 = (ulong)((uint)uVar9 << 0x10 | (uint)uVar9 & 0xffff);
    if (1 < iVar6 - 3U) {
      uVar10 = uVar9;
    }
    wVar7 = (uVar10 & 0xffffffff) * 0x100000001;
  }
LAB_0049f916:
  *pTruth = wVar7;
  return iVar5;
}

Assistant:

static inline int Abc_TtReadHex( word * pTruth, char * pString )
{
    int k, nVars, Digit, nDigits;
    // skip the first 2 symbols if they are "0x"
    if ( pString[0] == '0' && pString[1] == 'x' )
        pString += 2;
    // count the number of hex digits
    nDigits = 0;
    for ( k = 0; Abc_TtIsHexDigit(pString[k]); k++ )
        nDigits++;
    if ( nDigits == 1 )
    {
        if ( pString[0] == '0' || pString[0] == 'F' )
        {
            pTruth[0] = (pString[0] == '0') ? 0 : ~(word)0;
            return 0;
        }
        if ( pString[0] == '5' || pString[0] == 'A' )
        {
            pTruth[0] = (pString[0] == '5') ? s_Truths6Neg[0] : s_Truths6[0];
            return 1;
        }
    }
    // determine the number of variables
    nVars = 2 + Abc_Base2Log( nDigits );
    // clean storage
    for ( k = Abc_TtWordNum(nVars) - 1; k >= 0; k-- )
        pTruth[k] = 0;
    // read hexadecimal digits in the reverse order
    // (the last symbol in the string is the least significant digit)
    for ( k = 0; k < nDigits; k++ )
    {
        Digit = Abc_TtReadHexDigit( pString[nDigits - 1 - k] );
        assert( Digit >= 0 && Digit < 16 );
        Abc_TtSetHex( pTruth, k, Digit );
    }
    if ( nVars < 6 )
        pTruth[0] = Abc_Tt6Stretch( pTruth[0], nVars );
    return nVars;
}